

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void Map_Push(Map *tree,void *str,size_t size,void *id)

{
  Map *pMVar1;
  Map *pMVar2;
  size_t local_40;
  Map *local_38;
  
  local_38 = tree;
  Map_Scour(tree,str,size,&local_40,&local_38);
  pMVar2 = local_38;
  if (local_40 == size) {
    if (local_38->ID != (void *)0x0) {
      __assert_fail("tree->ID==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/map.c"
                    ,0x29,"void Map_Push(Map *, void *, size_t, void *)");
    }
  }
  else {
    for (; local_40 < size; local_40 = local_40 + 1) {
      pMVar1 = (Map *)calloc(1,0x810);
      pMVar2->delta[*(byte *)((long)str + local_40)] = pMVar1;
      pMVar2 = pMVar1;
    }
  }
  pMVar2->ID = id;
  pMVar2->is_final = '\x01';
  return;
}

Assistant:

void Map_Push(Map *tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		assert(tree->ID==NULL);
		tree->ID=id;
		tree->is_final=1;
		return;
	}
	for(temp;temp<size;++temp)
	{
		tree=tree->delta[((unsigned char*)str)[temp]]=calloc(1,sizeof(Map));
		/*
		Map_Init(
			tree=tree->delta[((unsigned char*)str)[temp]]=malloc(sizeof(Map))
			);
			*/
	}

	tree->ID=id;
	tree->is_final=1;

}